

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yin.c
# Opt level: O1

int thresholded_search(int32 *diff_window,fixed32 threshold,int start,int end)

{
  int iVar1;
  int iVar2;
  int i;
  int *piVar3;
  int iVar4;
  
  iVar2 = 0;
  if (start < end) {
    piVar3 = diff_window + start;
    iVar4 = 0x7fffffff;
    iVar2 = 0;
    do {
      iVar1 = *piVar3;
      if (iVar1 < iVar4) {
        iVar2 = start;
      }
      if (iVar1 < threshold) {
        return start;
      }
      if (iVar1 < iVar4) {
        iVar4 = iVar1;
      }
      piVar3 = piVar3 + 1;
      start = start + 1;
    } while (end != start);
  }
  return iVar2;
}

Assistant:

int
thresholded_search(int32 *diff_window, fixed32 threshold, int start, int end)
{
    int i, min, argmin;

    min = INT_MAX;
    argmin = 0;
    for (i = start; i < end; ++i) {
        int diff = diff_window[i];

        if (diff < threshold) {
            min = diff;
            argmin = i;
            break;
        }
        if (diff < min) {
            min = diff;
            argmin = i;
        }
    }
    return argmin;
}